

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

void __thiscall Mat::Mat(Mat *this,double x,double y,double z)

{
  double *pdVar1;
  
  pdVar1 = (double *)operator_new__(0x18);
  this->v_ = pdVar1;
  this->n_rows_ = 3;
  this->n_cols_ = 1;
  *pdVar1 = x;
  pdVar1[1] = y;
  pdVar1[2] = z;
  return;
}

Assistant:

Mat::Mat (const double x, const double y, const double z)   // 3dim-vector             
{
	v_ = new double [3];
	n_rows_ = 3;
	n_cols_ = 1;
	v_[0] = x;
	v_[1] = y;
	v_[2] = z; 
}